

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O1

char16_t * strcpyU16(char16_t *s1,char16_t *s2)

{
  char16_t cVar1;
  char16_t *pcVar2;
  
  pcVar2 = s1;
  if (s2 != (char16_t *)0x0 && s1 != (char16_t *)0x0) {
    do {
      cVar1 = *s2;
      s2 = s2 + (cVar1 != 0);
      *s1 = cVar1;
      s1 = s1 + 1;
    } while (*s2 != 0);
  }
  return pcVar2;
}

Assistant:

char16_t *strcpyU16(char16_t *s1, const char16_t *s2)
{
	if (s1 == NULL || s2 == NULL)
	{
		return s1;
	}
	char16_t *p1 = s1;
	char16_t *p2 = (char16_t *)s2;
	do
	{
		*p1++ = (*p2) ? *p2++ : u'\0';
	} while (*p2);
	return s1;
}